

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exomizer.h
# Opt level: O3

void decrunch_backwards(int level,membuf *inbuf,membuf *outbuf)

{
  undefined1 uVar1;
  undefined1 *puVar2;
  undefined1 *puVar3;
  undefined1 *puVar4;
  long lVar5;
  
  puVar4 = (undefined1 *)inbuf->buf;
  puVar3 = puVar4 + (long)inbuf->len + -1;
  if (puVar4 < puVar3) {
    do {
      puVar2 = puVar4 + 1;
      uVar1 = *puVar4;
      *puVar4 = *puVar3;
      *puVar3 = uVar1;
      puVar3 = puVar3 + -1;
      puVar4 = puVar2;
    } while (puVar2 < puVar3);
  }
  lVar5 = (long)outbuf->len;
  decrunch(level,inbuf,outbuf);
  puVar4 = (undefined1 *)inbuf->buf;
  puVar3 = puVar4 + (long)inbuf->len + -1;
  if (puVar4 < puVar3) {
    do {
      puVar2 = puVar4 + 1;
      uVar1 = *puVar4;
      *puVar4 = *puVar3;
      *puVar3 = uVar1;
      puVar3 = puVar3 + -1;
      puVar4 = puVar2;
    } while (puVar2 < puVar3);
  }
  puVar4 = (undefined1 *)((long)outbuf->buf + lVar5);
  puVar3 = puVar4 + (outbuf->len - lVar5) + -1;
  if (puVar4 < puVar3) {
    puVar4 = (undefined1 *)((long)outbuf->buf + lVar5);
    do {
      puVar2 = puVar4 + 1;
      uVar1 = *puVar4;
      *puVar4 = *puVar3;
      *puVar3 = uVar1;
      puVar3 = puVar3 + -1;
      puVar4 = puVar2;
    } while (puVar2 < puVar3);
  }
  return;
}

Assistant:

void decrunch_backwards(int level,
                        struct membuf *inbuf,
                        struct membuf *outbuf)
{
    int outpos;
    reverse_buffer(membuf_get(inbuf), membuf_memlen(inbuf));
    outpos = membuf_memlen(outbuf);

    decrunch(level, inbuf, outbuf);

    reverse_buffer(membuf_get(inbuf), membuf_memlen(inbuf));
    reverse_buffer((char*)membuf_get(outbuf) + outpos,
                   membuf_memlen(outbuf) - outpos);
}